

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

void Abc_NtkCompareSupports(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  char *__assertion;
  long lVar3;
  Abc_Obj_t *pObj;
  Abc_Obj_t *local_40;
  Abc_Obj_t *local_38;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcUtil.c"
                  ,0x888,"void Abc_NtkCompareSupports(Abc_Ntk_t *)");
  }
  pVVar2 = pNtk->vObjs;
  if (0 < pVVar2->nSize) {
    lVar3 = 0;
    do {
      local_38 = (Abc_Obj_t *)pVVar2->pArray[lVar3];
      if (local_38 != (Abc_Obj_t *)0x0) {
        if (((ulong)local_38 & 1) != 0) {
          __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_001f4d5e:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                        ,0x18e,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
        }
        if (local_38->pNtk->ntkType != ABC_NTK_STRASH) {
          __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
          goto LAB_001f4d5e;
        }
        if ((((local_38->vFanins).nSize == 2) && ((local_38->field_5).pData != (void *)0x0)) &&
           (0 < (local_38->vFanouts).nSize)) {
          pVVar2 = Abc_NtkNodeSupport(pNtk,&local_38,1);
          uVar1 = pVVar2->nSize;
          if (pVVar2->pArray != (void **)0x0) {
            free(pVVar2->pArray);
          }
          free(pVVar2);
          local_40 = local_38;
          while (local_40 = (Abc_Obj_t *)(local_40->field_5).pData, local_40 != (Abc_Obj_t *)0x0) {
            pVVar2 = Abc_NtkNodeSupport(pNtk,&local_40,1);
            if (uVar1 != pVVar2->nSize) {
              printf("Choice orig = %3d  Choice new = %3d\n",(ulong)uVar1);
            }
            if (pVVar2->pArray != (void **)0x0) {
              free(pVVar2->pArray);
            }
            free(pVVar2);
          }
        }
      }
      lVar3 = lVar3 + 1;
      pVVar2 = pNtk->vObjs;
    } while (lVar3 < pVVar2->nSize);
  }
  return;
}

Assistant:

void Abc_NtkCompareSupports( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vSupp;
    Abc_Obj_t * pObj, * pTemp;
    int i, nNodesOld;
    assert( Abc_NtkIsStrash(pNtk) );
    Abc_AigForEachAnd( pNtk, pObj, i )
    {
        if ( !Abc_AigNodeIsChoice(pObj) )
            continue;

        vSupp = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        nNodesOld = Vec_PtrSize(vSupp);
        Vec_PtrFree( vSupp );

        for ( pTemp = (Abc_Obj_t *)pObj->pData; pTemp; pTemp = (Abc_Obj_t *)pTemp->pData )
        {
            vSupp = Abc_NtkNodeSupport( pNtk, &pTemp, 1 );
            if ( nNodesOld != Vec_PtrSize(vSupp) )
                printf( "Choice orig = %3d  Choice new = %3d\n", nNodesOld, Vec_PtrSize(vSupp) );
            Vec_PtrFree( vSupp );
        }
    }
}